

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpMakeHttpRequest(Upnp_HttpMethod method,char *url,void *handle,UpnpString *headers,
                       char *contentType,int contentLength,int timeout)

{
  int iVar1;
  membuffer mStack_110;
  uri_type uStack_f0;
  
  iVar1 = -0x65;
  if (handle != (void *)0x0 && url != (char *)0x0) {
    *(undefined8 *)((long)handle + 0x280) = 1;
    iVar1 = MakeGenericMessage(method,url,&mStack_110,&uStack_f0,contentLength,contentType,headers);
    if (iVar1 == 0) {
      iVar1 = http_SendMessage((SOCKINFO *)handle,&timeout,"b",mStack_110.buf,mStack_110.length);
      membuffer_destroy(&mStack_110);
      httpmsg_destroy((http_message_t *)((long)handle + 0x90));
      parser_response_init((http_parser_t *)((long)handle + 0x90),method);
    }
  }
  return iVar1;
}

Assistant:

int UpnpMakeHttpRequest(Upnp_HttpMethod method,
	const char *url,
	void *handle,
	UpnpString *headers,
	const char *contentType,
	int contentLength,
	int timeout)
{
	return http_MakeHttpRequest(method,
		url,
		handle,
		headers,
		contentType,
		contentLength,
		timeout);
}